

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix2 * matrix2_invert(matrix2 *self)

{
  matrix2 *pmVar1;
  matrix2 inverse;
  anon_union_32_5_d0a4420b_for_matrix2_0 local_28;
  
  pmVar1 = matrix2_inverse(self,(matrix2 *)&local_28.field_1);
  if (pmVar1 != (matrix2 *)0x0) {
    (self->field_0).m[2] = local_28.m[2];
    (self->field_0).m[3] = local_28.m[3];
    (self->field_0).m[0] = local_28.m[0];
    (self->field_0).m[1] = local_28.m[1];
  }
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_invert(struct matrix2 *self)
{
	struct matrix2 inverse;
	uint8_t i;

	if (matrix2_inverse(self, &inverse)) {
		for (i = 0; i < 4; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}